

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.cxx
# Opt level: O0

void __thiscall ViewTest::indexToOffsetTest<false>(ViewTest *this)

{
  undefined1 *puVar1;
  allocator<int> *this_00;
  allocator<unsigned_long> *paVar2;
  ulong uVar3;
  size_t sVar4;
  unsigned_long args;
  reference pvVar5;
  size_t sVar6;
  reference piVar7;
  bool local_6c9;
  size_t local_6c8;
  size_t offset_5;
  size_t index_5;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_6b0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_6a8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_6a0;
  undefined1 local_698 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_5;
  undefined1 local_650 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> strides_1;
  undefined1 local_630 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_5;
  size_t list_2 [24];
  bool local_549;
  size_t local_548;
  size_t offset_4;
  size_t index_4;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_530;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_528;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_520;
  undefined1 local_518 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_4;
  undefined1 local_4d0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> strides;
  undefined1 local_4b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_4;
  size_t list_1 [24];
  bool local_3c9;
  size_t local_3c8;
  size_t offset_3;
  size_t index_3;
  size_t trueOffset_1;
  CoordinateOrder local_3a8 [2];
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_3a0;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_398;
  undefined1 local_390 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_3;
  undefined1 local_348 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_3;
  pointer local_328;
  size_t offset_2;
  size_t index_2;
  CoordinateOrder local_310 [2];
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_308;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_300;
  undefined1 local_2f8 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_2;
  undefined1 local_2b0 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_2;
  size_t list [24];
  size_t local_1d0;
  size_t offset_1;
  size_t index_1;
  undefined1 local_1b8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> c;
  CoordinateOrder local_198 [2];
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_190;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_188;
  undefined1 local_180 [8];
  View<int,_false,_std::allocator<unsigned_long>_> w;
  CoordinateOrder local_138 [2];
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_130;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_128;
  undefined1 local_120 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v_1;
  undefined1 local_d8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape_1;
  size_t local_b8;
  size_t offset;
  size_t index;
  size_t trueOffset;
  CoordinateOrder local_98 [2];
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_90;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_88;
  undefined1 local_80 [8];
  View<int,_false,_std::allocator<unsigned_long>_> v;
  allocator<unsigned_long> local_29;
  undefined1 local_28 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> shape;
  ViewTest *this_local;
  
  shape.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<unsigned_long>::allocator(&local_29);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,3,&local_29);
  std::allocator<unsigned_long>::~allocator(&local_29);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,0);
  *pvVar5 = 3;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,1);
  *pvVar5 = 2;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28,2);
  *pvVar5 = 4;
  local_88._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  local_90._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  local_98[1] = 1;
  local_98[0] = LastMajorOrder;
  std::allocator<int>::allocator((allocator<int> *)((long)&trueOffset + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_80,local_88,local_90,this->data_
             ,local_98 + 1,local_98,(allocator<int> *)((long)&trueOffset + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&trueOffset + 7));
  index = 0;
  offset = 0;
  while( true ) {
    sVar4 = offset;
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
    if (sVar6 <= sVar4) break;
    local_b8 = 0;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80,offset,&local_b8);
    shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = local_b8 == index;
    test((bool *)((long)&shape_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    index = index + 1;
    offset = offset + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_28);
  puVar1 = &v_1.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_1.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,0);
  *pvVar5 = 3;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,1);
  *pvVar5 = 2;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,2);
  *pvVar5 = 4;
  local_128._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
  local_130._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
  local_138[1] = 1;
  local_138[0] = FirstMajorOrder;
  puVar1 = &w.geometry_.field_0x37;
  std::allocator<int>::allocator((allocator<int> *)puVar1);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_120,local_128,local_130,
             this->data_,local_138 + 1,local_138,(allocator_type *)puVar1);
  std::allocator<int>::~allocator((allocator<int> *)&w.geometry_.field_0x37);
  local_188._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
  local_190._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
  local_198[1] = 1;
  local_198[0] = LastMajorOrder;
  this_00 = (allocator<int> *)
            ((long)&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<int>::allocator(this_00);
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_180,local_188,local_190,
             this->data_,local_198 + 1,local_198,this_00);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&c.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&index_1 + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,3,
             (allocator<unsigned_long> *)((long)&index_1 + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&index_1 + 7));
  offset_1 = 0;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,0);
  *pvVar5 = 0;
  while( true ) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,0);
    uVar3 = *pvVar5;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,0);
    if (*pvVar5 <= uVar3) break;
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,1);
    *pvVar5 = 0;
    while( true ) {
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,1);
      uVar3 = *pvVar5;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,1);
      if (*pvVar5 <= uVar3) break;
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,2);
      *pvVar5 = 0;
      while( true ) {
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,2);
        uVar3 = *pvVar5;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8,2);
        if (*pvVar5 <= uVar3) break;
        local_1d0 = 0;
        andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
                  ((View<int,_false,_std::allocator<unsigned_long>_> *)local_120,offset_1,&local_1d0
                  );
        sVar6 = local_1d0;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,0);
        sVar4 = *pvVar5;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,1);
        args = *pvVar5;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,2);
        piVar7 = andres::View<int,false,std::allocator<unsigned_long>>::operator()
                           ((View<int,false,std::allocator<unsigned_long>> *)local_180,sVar4,args,
                            *pvVar5);
        list[0x17]._7_1_ = sVar6 == (long)*piVar7;
        test((bool *)((long)list + 0xbf));
        offset_1 = offset_1 + 1;
        pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,2);
        *pvVar5 = *pvVar5 + 1;
      }
      pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,1);
      *pvVar5 = *pvVar5 + 1;
    }
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8,0);
    *pvVar5 = *pvVar5 + 1;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_1b8);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_180);
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_120);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_d8);
  memcpy(&shape_2.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,&DAT_002c06c0,0xc0);
  puVar1 = &v_2.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_2.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0,0);
  *pvVar5 = 3;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0,1);
  *pvVar5 = 2;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0,2);
  *pvVar5 = 4;
  local_300._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
  local_308._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
  local_310[1] = 0;
  local_310[0] = LastMajorOrder;
  std::allocator<int>::allocator((allocator<int> *)((long)&index_2 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_2f8,local_300,local_308,
             this->data_,local_310 + 1,local_310,(allocator<int> *)((long)&index_2 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&index_2 + 7));
  offset_2 = 0;
  while( true ) {
    sVar4 = offset_2;
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2f8);
    if (sVar6 <= sVar4) break;
    local_328 = (pointer)0x0;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2f8,offset_2,
               (size_t *)&local_328);
    shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._7_1_ = local_328 == (pointer)list[offset_2 - 1];
    test((bool *)((long)&shape_3.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    offset_2 = offset_2 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_2f8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2b0);
  puVar1 = &v_3.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_348,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_3.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_348,0);
  *pvVar5 = 3;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_348,1);
  *pvVar5 = 2;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_348,2);
  *pvVar5 = 4;
  local_398._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_348);
  local_3a0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_348);
  local_3a8[1] = 0;
  local_3a8[0] = FirstMajorOrder;
  std::allocator<int>::allocator((allocator<int> *)((long)&trueOffset_1 + 7));
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_390,local_398,local_3a0,
             this->data_,local_3a8 + 1,local_3a8,(allocator<int> *)((long)&trueOffset_1 + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&trueOffset_1 + 7));
  index_3 = 0;
  offset_3 = 0;
  while( true ) {
    sVar4 = offset_3;
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_390);
    if (sVar6 <= sVar4) break;
    local_3c8 = 0;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_390,offset_3,&local_3c8);
    local_3c9 = local_3c8 == index_3;
    test(&local_3c9);
    index_3 = index_3 + 1;
    offset_3 = offset_3 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_390);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_348);
  memcpy(&shape_4.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,&DAT_002c0780,0xc0);
  paVar2 = (allocator<unsigned_long> *)
           ((long)&strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b0,3,paVar2);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&strides.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b0,0);
  *pvVar5 = 3;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b0,1);
  *pvVar5 = 4;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b0,2);
  *pvVar5 = 2;
  puVar1 = &v_4.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d0,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_4.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d0,0);
  *pvVar5 = 2;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d0,1);
  *pvVar5 = 10;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d0,2);
  *pvVar5 = 0x23;
  local_520._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b0);
  local_528._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b0);
  local_530._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d0);
  index_4._4_4_ = 1;
  std::allocator<int>::allocator((allocator<int> *)((long)&index_4 + 3));
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_518,local_520,local_528,
             local_530,this->data100_ + 0x1e,(CoordinateOrder *)((long)&index_4 + 4),
             (allocator<int> *)((long)&index_4 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&index_4 + 3));
  offset_4 = 0;
  while( true ) {
    sVar4 = offset_4;
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_518);
    if (sVar6 <= sVar4) break;
    local_548 = 0;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_518,offset_4,&local_548);
    local_549 = local_548 == list_1[offset_4 - 1] - 0x1e;
    test(&local_549);
    offset_4 = offset_4 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_518);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_4b0);
  memcpy(&shape_5.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage,&DAT_002c0840,0xc0);
  paVar2 = (allocator<unsigned_long> *)
           ((long)&strides_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_long>::allocator(paVar2);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630,3,paVar2);
  std::allocator<unsigned_long>::~allocator
            ((allocator<unsigned_long> *)
             ((long)&strides_1.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630,0);
  *pvVar5 = 3;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630,1);
  *pvVar5 = 4;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630,2);
  *pvVar5 = 2;
  puVar1 = &v_5.geometry_.field_0x37;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)puVar1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_650,3,
             (allocator_type *)puVar1);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)&v_5.geometry_.field_0x37);
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_650,0);
  *pvVar5 = 2;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_650,1);
  *pvVar5 = 10;
  pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_650,2);
  *pvVar5 = 0x23;
  local_6a0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630);
  local_6a8._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630);
  local_6b0._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                 ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_650);
  index_5._4_4_ = 0;
  std::allocator<int>::allocator((allocator<int> *)((long)&index_5 + 3));
  andres::View<int,false,std::allocator<unsigned_long>>::
  View<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            ((View<int,false,std::allocator<unsigned_long>> *)local_698,local_6a0,local_6a8,
             local_6b0,this->data100_ + 0x1e,(CoordinateOrder *)((long)&index_5 + 4),
             (allocator<int> *)((long)&index_5 + 3));
  std::allocator<int>::~allocator((allocator<int> *)((long)&index_5 + 3));
  offset_5 = 0;
  while( true ) {
    sVar4 = offset_5;
    sVar6 = andres::View<int,_false,_std::allocator<unsigned_long>_>::size
                      ((View<int,_false,_std::allocator<unsigned_long>_> *)local_698);
    if (sVar6 <= sVar4) break;
    local_6c8 = 0;
    andres::View<int,_false,_std::allocator<unsigned_long>_>::indexToOffset
              ((View<int,_false,_std::allocator<unsigned_long>_> *)local_698,offset_5,&local_6c8);
    local_6c9 = local_6c8 == list_2[offset_5 - 1] - 0x1e;
    test(&local_6c9);
    offset_5 = offset_5 + 1;
  }
  andres::View<int,_false,_std::allocator<unsigned_long>_>::~View
            ((View<int,_false,_std::allocator<unsigned_long>_> *)local_698);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_650);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_630);
  return;
}

Assistant:

void ViewTest::indexToOffsetTest() {
    // test cases: (externalFirstMajorOrder, internalFirstMajorOrder)
    // (false, false)
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);

        std::size_t trueOffset = 0;
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == trueOffset);
            ++trueOffset;
        }
    }
    // (false, true)
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::FirstMajorOrder);
        andres::View<int> w(shape.begin(), shape.end(),
            data_, andres::LastMajorOrder, andres::LastMajorOrder);
    
        std::vector<std::size_t> c(3);
        std::size_t index = 0;
        for(c[0]=0; c[0]<shape[0]; ++c[0]) 
        for(c[1]=0; c[1]<shape[1]; ++c[1])
        for(c[2]=0; c[2]<shape[2]; ++c[2]) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == static_cast<std::size_t>(w(c[0], c[1], c[2])));
            ++index;
        }
    
    }
    // (true, false)
    {
        std::size_t list[] = {0, 8, 16, 4, 12, 20, 1, 9, 17, 5, 13, 21, 
            2, 10, 18, 6, 14, 22, 3, 11, 19, 7, 15, 23}; 
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::FirstMajorOrder, andres::LastMajorOrder);

        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == list[index]);
        }
    }
    
    // (true, true)
    {
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 2;
        shape[2] = 4;
        andres::View<int, constTarget> v(shape.begin(), shape.end(),
            data_, andres::FirstMajorOrder, andres::FirstMajorOrder);

        std::size_t trueOffset = 0;
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == trueOffset);
            ++trueOffset;
        }
    }

    // test also with non-trivial strides and non-zero offset
    // (false)
    {
        std::size_t list[] = {30, 32, 34, 40, 42, 44, 50, 52, 54, 60, 62, 64, 
            65, 67, 69, 75, 77, 79, 85, 87, 89, 95, 97, 99}; 
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        std::vector<std::size_t> strides(3);
        strides[0] = 2;
        strides[1] = 10;
        strides[2] = 35;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
            data100_+30, andres::LastMajorOrder);
        
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == list[index]-30);
        }
    }
    // (true)
    {
        std::size_t list[] = {30, 65, 40, 75, 50, 85, 60, 95, 32, 67, 42, 77, 
            52, 87, 62, 97, 34, 69, 44, 79, 54, 89, 64, 99};
        std::vector<std::size_t> shape(3);
        shape[0] = 3;
        shape[1] = 4;
        shape[2] = 2;
        std::vector<std::size_t> strides(3);
        strides[0] = 2;
        strides[1] = 10;
        strides[2] = 35;
        andres::View<int, constTarget> v(shape.begin(), shape.end(), strides.begin(),
            data100_+30, andres::FirstMajorOrder);
        
        for(std::size_t index=0; index<v.size(); ++index) {
            std::size_t offset = 0;
            v.indexToOffset(index, offset);
            test(offset == list[index]-30);
        }
    }
}